

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::accumulateDerivativesDispatch1<true>
          (BeagleCPUImpl<double,_1,_1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  if (outSumDerivatives == (double *)0x0) {
    BeagleCPUImpl<double,1,1>::accumulateDerivativesDispatch2<true,false>
              ((BeagleCPUImpl<double,1,1> *)this,outDerivatives,(double *)0x0,
               outSumSquaredDerivatives);
    return;
  }
  BeagleCPUImpl<double,1,1>::accumulateDerivativesDispatch2<true,true>
            ((BeagleCPUImpl<double,1,1> *)this,outDerivatives,outSumDerivatives,
             outSumSquaredDerivatives);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE template <bool DoDerivatives>
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}